

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

MatrixShaderEvalFunc
deqp::gles3::Functional::MatrixCaseUtils::getEvalFunc(ShaderInput *in0,ShaderInput *in1,MatrixOp op)

{
  DataType DVar1;
  MatrixOp op_local;
  ShaderInput *in1_local;
  ShaderInput *in0_local;
  
  DVar1 = op << 0xe | in0->dataType << 7 | in1->dataType;
  if (DVar1 == 0x281) {
    in0_local = (ShaderInput *)Evaluator<0,_5,_1>::evaluate;
  }
  else if (DVar1 == 0x285) {
    in0_local = (ShaderInput *)Evaluator<0,_5,_5>::evaluate;
  }
  else if (DVar1 == 0x301) {
    in0_local = (ShaderInput *)Evaluator<0,_6,_1>::evaluate;
  }
  else if (DVar1 == 0x306) {
    in0_local = (ShaderInput *)Evaluator<0,_6,_6>::evaluate;
  }
  else if (DVar1 == 0x381) {
    in0_local = (ShaderInput *)Evaluator<0,_7,_1>::evaluate;
  }
  else if (DVar1 == 0x387) {
    in0_local = (ShaderInput *)Evaluator<0,_7,_7>::evaluate;
  }
  else if (DVar1 == 0x401) {
    in0_local = (ShaderInput *)Evaluator<0,_8,_1>::evaluate;
  }
  else if (DVar1 == 0x408) {
    in0_local = (ShaderInput *)Evaluator<0,_8,_8>::evaluate;
  }
  else if (DVar1 == 0x481) {
    in0_local = (ShaderInput *)Evaluator<0,_9,_1>::evaluate;
  }
  else if (DVar1 == 0x489) {
    in0_local = (ShaderInput *)Evaluator<0,_9,_9>::evaluate;
  }
  else if (DVar1 == 0x501) {
    in0_local = (ShaderInput *)Evaluator<0,_10,_1>::evaluate;
  }
  else if (DVar1 == 0x50a) {
    in0_local = (ShaderInput *)Evaluator<0,_10,_10>::evaluate;
  }
  else if (DVar1 == 0x581) {
    in0_local = (ShaderInput *)Evaluator<0,_11,_1>::evaluate;
  }
  else if (DVar1 == 0x58b) {
    in0_local = (ShaderInput *)Evaluator<0,_11,_11>::evaluate;
  }
  else if (DVar1 == 0x601) {
    in0_local = (ShaderInput *)Evaluator<0,_12,_1>::evaluate;
  }
  else if (DVar1 == 0x60c) {
    in0_local = (ShaderInput *)Evaluator<0,_12,_12>::evaluate;
  }
  else if (DVar1 == 0x681) {
    in0_local = (ShaderInput *)Evaluator<0,_13,_1>::evaluate;
  }
  else if (DVar1 == 0x68d) {
    in0_local = (ShaderInput *)Evaluator<0,_13,_13>::evaluate;
  }
  else if (DVar1 == 0x4281) {
    in0_local = (ShaderInput *)Evaluator<1,_5,_1>::evaluate;
  }
  else if (DVar1 == 0x4285) {
    in0_local = (ShaderInput *)Evaluator<1,_5,_5>::evaluate;
  }
  else if (DVar1 == 0x4301) {
    in0_local = (ShaderInput *)Evaluator<1,_6,_1>::evaluate;
  }
  else if (DVar1 == 0x4306) {
    in0_local = (ShaderInput *)Evaluator<1,_6,_6>::evaluate;
  }
  else if (DVar1 == 0x4381) {
    in0_local = (ShaderInput *)Evaluator<1,_7,_1>::evaluate;
  }
  else if (DVar1 == 0x4387) {
    in0_local = (ShaderInput *)Evaluator<1,_7,_7>::evaluate;
  }
  else if (DVar1 == 0x4401) {
    in0_local = (ShaderInput *)Evaluator<1,_8,_1>::evaluate;
  }
  else if (DVar1 == 0x4408) {
    in0_local = (ShaderInput *)Evaluator<1,_8,_8>::evaluate;
  }
  else if (DVar1 == 0x4481) {
    in0_local = (ShaderInput *)Evaluator<1,_9,_1>::evaluate;
  }
  else if (DVar1 == 0x4489) {
    in0_local = (ShaderInput *)Evaluator<1,_9,_9>::evaluate;
  }
  else if (DVar1 == 0x4501) {
    in0_local = (ShaderInput *)Evaluator<1,_10,_1>::evaluate;
  }
  else if (DVar1 == 0x450a) {
    in0_local = (ShaderInput *)Evaluator<1,_10,_10>::evaluate;
  }
  else if (DVar1 == 0x4581) {
    in0_local = (ShaderInput *)Evaluator<1,_11,_1>::evaluate;
  }
  else if (DVar1 == 0x458b) {
    in0_local = (ShaderInput *)Evaluator<1,_11,_11>::evaluate;
  }
  else if (DVar1 == 0x4601) {
    in0_local = (ShaderInput *)Evaluator<1,_12,_1>::evaluate;
  }
  else if (DVar1 == 0x460c) {
    in0_local = (ShaderInput *)Evaluator<1,_12,_12>::evaluate;
  }
  else if (DVar1 == 0x4681) {
    in0_local = (ShaderInput *)Evaluator<1,_13,_1>::evaluate;
  }
  else if (DVar1 == 0x468d) {
    in0_local = (ShaderInput *)Evaluator<1,_13,_13>::evaluate;
  }
  else if (DVar1 == 0x8105) {
    in0_local = (ShaderInput *)Evaluator<2,_2,_5>::evaluate;
  }
  else if (DVar1 == 0x8108) {
    in0_local = (ShaderInput *)Evaluator<2,_2,_8>::evaluate;
  }
  else if (DVar1 == 0x810b) {
    in0_local = (ShaderInput *)Evaluator<2,_2,_11>::evaluate;
  }
  else if (DVar1 == 0x8186) {
    in0_local = (ShaderInput *)Evaluator<2,_3,_6>::evaluate;
  }
  else if (DVar1 == 0x8189) {
    in0_local = (ShaderInput *)Evaluator<2,_3,_9>::evaluate;
  }
  else if (DVar1 == 0x818c) {
    in0_local = (ShaderInput *)Evaluator<2,_3,_12>::evaluate;
  }
  else if (DVar1 == 0x8207) {
    in0_local = (ShaderInput *)Evaluator<2,_4,_7>::evaluate;
  }
  else if (DVar1 == 0x820a) {
    in0_local = (ShaderInput *)Evaluator<2,_4,_10>::evaluate;
  }
  else if (DVar1 == 0x820d) {
    in0_local = (ShaderInput *)Evaluator<2,_4,_13>::evaluate;
  }
  else if (DVar1 == 0x8281) {
    in0_local = (ShaderInput *)Evaluator<2,_5,_1>::evaluate;
  }
  else if (DVar1 == 0x8282) {
    in0_local = (ShaderInput *)Evaluator<2,_5,_2>::evaluate;
  }
  else if (DVar1 == 0x8285) {
    in0_local = (ShaderInput *)Evaluator<2,_5,_5>::evaluate;
  }
  else if (DVar1 == 0x8288) {
    in0_local = (ShaderInput *)Evaluator<2,_5,_8>::evaluate;
  }
  else if (DVar1 == 0x828b) {
    in0_local = (ShaderInput *)Evaluator<2,_5,_11>::evaluate;
  }
  else if (DVar1 == 0x8301) {
    in0_local = (ShaderInput *)Evaluator<2,_6,_1>::evaluate;
  }
  else if (DVar1 == 0x8302) {
    in0_local = (ShaderInput *)Evaluator<2,_6,_2>::evaluate;
  }
  else if (DVar1 == 0x8305) {
    in0_local = (ShaderInput *)Evaluator<2,_6,_5>::evaluate;
  }
  else if (DVar1 == 0x8308) {
    in0_local = (ShaderInput *)Evaluator<2,_6,_8>::evaluate;
  }
  else if (DVar1 == 0x830b) {
    in0_local = (ShaderInput *)Evaluator<2,_6,_11>::evaluate;
  }
  else if (DVar1 == 0x8381) {
    in0_local = (ShaderInput *)Evaluator<2,_7,_1>::evaluate;
  }
  else if (DVar1 == 0x8382) {
    in0_local = (ShaderInput *)Evaluator<2,_7,_2>::evaluate;
  }
  else if (DVar1 == 0x8385) {
    in0_local = (ShaderInput *)Evaluator<2,_7,_5>::evaluate;
  }
  else if (DVar1 == 0x8388) {
    in0_local = (ShaderInput *)Evaluator<2,_7,_8>::evaluate;
  }
  else if (DVar1 == 0x838b) {
    in0_local = (ShaderInput *)Evaluator<2,_7,_11>::evaluate;
  }
  else if (DVar1 == 0x8401) {
    in0_local = (ShaderInput *)Evaluator<2,_8,_1>::evaluate;
  }
  else if (DVar1 == 0x8403) {
    in0_local = (ShaderInput *)Evaluator<2,_8,_3>::evaluate;
  }
  else if (DVar1 == 0x8406) {
    in0_local = (ShaderInput *)Evaluator<2,_8,_6>::evaluate;
  }
  else if (DVar1 == 0x8409) {
    in0_local = (ShaderInput *)Evaluator<2,_8,_9>::evaluate;
  }
  else if (DVar1 == 0x840c) {
    in0_local = (ShaderInput *)Evaluator<2,_8,_12>::evaluate;
  }
  else if (DVar1 == 0x8481) {
    in0_local = (ShaderInput *)Evaluator<2,_9,_1>::evaluate;
  }
  else if (DVar1 == 0x8483) {
    in0_local = (ShaderInput *)Evaluator<2,_9,_3>::evaluate;
  }
  else if (DVar1 == 0x8486) {
    in0_local = (ShaderInput *)Evaluator<2,_9,_6>::evaluate;
  }
  else if (DVar1 == 0x8489) {
    in0_local = (ShaderInput *)Evaluator<2,_9,_9>::evaluate;
  }
  else if (DVar1 == 0x848c) {
    in0_local = (ShaderInput *)Evaluator<2,_9,_12>::evaluate;
  }
  else if (DVar1 == 0x8501) {
    in0_local = (ShaderInput *)Evaluator<2,_10,_1>::evaluate;
  }
  else if (DVar1 == 0x8503) {
    in0_local = (ShaderInput *)Evaluator<2,_10,_3>::evaluate;
  }
  else if (DVar1 == 0x8506) {
    in0_local = (ShaderInput *)Evaluator<2,_10,_6>::evaluate;
  }
  else if (DVar1 == 0x8509) {
    in0_local = (ShaderInput *)Evaluator<2,_10,_9>::evaluate;
  }
  else if (DVar1 == 0x850c) {
    in0_local = (ShaderInput *)Evaluator<2,_10,_12>::evaluate;
  }
  else if (DVar1 == 0x8581) {
    in0_local = (ShaderInput *)Evaluator<2,_11,_1>::evaluate;
  }
  else if (DVar1 == 0x8584) {
    in0_local = (ShaderInput *)Evaluator<2,_11,_4>::evaluate;
  }
  else if (DVar1 == 0x8587) {
    in0_local = (ShaderInput *)Evaluator<2,_11,_7>::evaluate;
  }
  else if (DVar1 == 0x858a) {
    in0_local = (ShaderInput *)Evaluator<2,_11,_10>::evaluate;
  }
  else if (DVar1 == 0x858d) {
    in0_local = (ShaderInput *)Evaluator<2,_11,_13>::evaluate;
  }
  else if (DVar1 == 0x8601) {
    in0_local = (ShaderInput *)Evaluator<2,_12,_1>::evaluate;
  }
  else if (DVar1 == 0x8604) {
    in0_local = (ShaderInput *)Evaluator<2,_12,_4>::evaluate;
  }
  else if (DVar1 == 0x8607) {
    in0_local = (ShaderInput *)Evaluator<2,_12,_7>::evaluate;
  }
  else if (DVar1 == 0x860a) {
    in0_local = (ShaderInput *)Evaluator<2,_12,_10>::evaluate;
  }
  else if (DVar1 == 0x860d) {
    in0_local = (ShaderInput *)Evaluator<2,_12,_13>::evaluate;
  }
  else if (DVar1 == 0x8681) {
    in0_local = (ShaderInput *)Evaluator<2,_13,_1>::evaluate;
  }
  else if (DVar1 == 0x8684) {
    in0_local = (ShaderInput *)Evaluator<2,_13,_4>::evaluate;
  }
  else if (DVar1 == 0x8687) {
    in0_local = (ShaderInput *)Evaluator<2,_13,_7>::evaluate;
  }
  else if (DVar1 == 0x868a) {
    in0_local = (ShaderInput *)Evaluator<2,_13,_10>::evaluate;
  }
  else if (DVar1 == 0x868d) {
    in0_local = (ShaderInput *)Evaluator<2,_13,_13>::evaluate;
  }
  else if (DVar1 == 0xc281) {
    in0_local = (ShaderInput *)Evaluator<3,_5,_1>::evaluate;
  }
  else if (DVar1 == 0xc285) {
    in0_local = (ShaderInput *)Evaluator<3,_5,_5>::evaluate;
  }
  else if (DVar1 == 0xc301) {
    in0_local = (ShaderInput *)Evaluator<3,_6,_1>::evaluate;
  }
  else if (DVar1 == 0xc306) {
    in0_local = (ShaderInput *)Evaluator<3,_6,_6>::evaluate;
  }
  else if (DVar1 == 0xc381) {
    in0_local = (ShaderInput *)Evaluator<3,_7,_1>::evaluate;
  }
  else if (DVar1 == 0xc387) {
    in0_local = (ShaderInput *)Evaluator<3,_7,_7>::evaluate;
  }
  else if (DVar1 == 0xc401) {
    in0_local = (ShaderInput *)Evaluator<3,_8,_1>::evaluate;
  }
  else if (DVar1 == 0xc408) {
    in0_local = (ShaderInput *)Evaluator<3,_8,_8>::evaluate;
  }
  else if (DVar1 == 0xc481) {
    in0_local = (ShaderInput *)Evaluator<3,_9,_1>::evaluate;
  }
  else if (DVar1 == 0xc489) {
    in0_local = (ShaderInput *)Evaluator<3,_9,_9>::evaluate;
  }
  else if (DVar1 == 0xc501) {
    in0_local = (ShaderInput *)Evaluator<3,_10,_1>::evaluate;
  }
  else if (DVar1 == 0xc50a) {
    in0_local = (ShaderInput *)Evaluator<3,_10,_10>::evaluate;
  }
  else if (DVar1 == 0xc581) {
    in0_local = (ShaderInput *)Evaluator<3,_11,_1>::evaluate;
  }
  else if (DVar1 == 0xc58b) {
    in0_local = (ShaderInput *)Evaluator<3,_11,_11>::evaluate;
  }
  else if (DVar1 == 0xc601) {
    in0_local = (ShaderInput *)Evaluator<3,_12,_1>::evaluate;
  }
  else if (DVar1 == 0xc60c) {
    in0_local = (ShaderInput *)Evaluator<3,_12,_12>::evaluate;
  }
  else if (DVar1 == 0xc681) {
    in0_local = (ShaderInput *)Evaluator<3,_13,_1>::evaluate;
  }
  else if (DVar1 == 0xc68d) {
    in0_local = (ShaderInput *)Evaluator<3,_13,_13>::evaluate;
  }
  else if (DVar1 == 0x10285) {
    in0_local = (ShaderInput *)Evaluator<4,_5,_5>::evaluate;
  }
  else if (DVar1 == 0x10306) {
    in0_local = (ShaderInput *)Evaluator<4,_6,_6>::evaluate;
  }
  else if (DVar1 == 0x10387) {
    in0_local = (ShaderInput *)Evaluator<4,_7,_7>::evaluate;
  }
  else if (DVar1 == 0x10408) {
    in0_local = (ShaderInput *)Evaluator<4,_8,_8>::evaluate;
  }
  else if (DVar1 == 0x10489) {
    in0_local = (ShaderInput *)Evaluator<4,_9,_9>::evaluate;
  }
  else if (DVar1 == 0x1050a) {
    in0_local = (ShaderInput *)Evaluator<4,_10,_10>::evaluate;
  }
  else if (DVar1 == 0x1058b) {
    in0_local = (ShaderInput *)Evaluator<4,_11,_11>::evaluate;
  }
  else if (DVar1 == 0x1060c) {
    in0_local = (ShaderInput *)Evaluator<4,_12,_12>::evaluate;
  }
  else if (DVar1 == 0x1068d) {
    in0_local = (ShaderInput *)Evaluator<4,_13,_13>::evaluate;
  }
  else if (DVar1 == 0x14102) {
    in0_local = (ShaderInput *)Evaluator<5,_2,_2>::evaluate;
  }
  else if (DVar1 == 0x14103) {
    in0_local = (ShaderInput *)Evaluator<5,_2,_3>::evaluate;
  }
  else if (DVar1 == 0x14104) {
    in0_local = (ShaderInput *)Evaluator<5,_2,_4>::evaluate;
  }
  else if (DVar1 == 0x14182) {
    in0_local = (ShaderInput *)Evaluator<5,_3,_2>::evaluate;
  }
  else if (DVar1 == 0x14183) {
    in0_local = (ShaderInput *)Evaluator<5,_3,_3>::evaluate;
  }
  else if (DVar1 == 0x14184) {
    in0_local = (ShaderInput *)Evaluator<5,_3,_4>::evaluate;
  }
  else if (DVar1 == 0x14202) {
    in0_local = (ShaderInput *)Evaluator<5,_4,_2>::evaluate;
  }
  else if (DVar1 == 0x14203) {
    in0_local = (ShaderInput *)Evaluator<5,_4,_3>::evaluate;
  }
  else if (DVar1 == 0x14204) {
    in0_local = (ShaderInput *)Evaluator<5,_4,_4>::evaluate;
  }
  else if (DVar1 == 0x182de) {
    in0_local = (ShaderInput *)Evaluator<6,_5,_94>::evaluate;
  }
  else if (DVar1 == 0x1835e) {
    in0_local = (ShaderInput *)Evaluator<6,_6,_94>::evaluate;
  }
  else if (DVar1 == 0x183de) {
    in0_local = (ShaderInput *)Evaluator<6,_7,_94>::evaluate;
  }
  else if (DVar1 == 0x1845e) {
    in0_local = (ShaderInput *)Evaluator<6,_8,_94>::evaluate;
  }
  else if (DVar1 == 0x184de) {
    in0_local = (ShaderInput *)Evaluator<6,_9,_94>::evaluate;
  }
  else if (DVar1 == 0x1855e) {
    in0_local = (ShaderInput *)Evaluator<6,_10,_94>::evaluate;
  }
  else if (DVar1 == 0x185de) {
    in0_local = (ShaderInput *)Evaluator<6,_11,_94>::evaluate;
  }
  else if (DVar1 == 0x1865e) {
    in0_local = (ShaderInput *)Evaluator<6,_12,_94>::evaluate;
  }
  else if (DVar1 == 0x186de) {
    in0_local = (ShaderInput *)Evaluator<6,_13,_94>::evaluate;
  }
  else if (DVar1 == 0x1c2de) {
    in0_local = (ShaderInput *)Evaluator<7,_5,_94>::evaluate;
  }
  else if (DVar1 == 0x1c4de) {
    in0_local = (ShaderInput *)Evaluator<7,_9,_94>::evaluate;
  }
  else if (DVar1 == 0x1c6de) {
    in0_local = (ShaderInput *)Evaluator<7,_13,_94>::evaluate;
  }
  else if (DVar1 == 0x202de) {
    in0_local = (ShaderInput *)Evaluator<8,_5,_94>::evaluate;
  }
  else if (DVar1 == 0x204de) {
    in0_local = (ShaderInput *)Evaluator<8,_9,_94>::evaluate;
  }
  else if (DVar1 == 0x206de) {
    in0_local = (ShaderInput *)Evaluator<8,_13,_94>::evaluate;
  }
  else if (DVar1 == 0x242de) {
    in0_local = (ShaderInput *)Evaluator<9,_5,_94>::evaluate;
  }
  else if (DVar1 == 0x2435e) {
    in0_local = (ShaderInput *)Evaluator<9,_6,_94>::evaluate;
  }
  else if (DVar1 == 0x243de) {
    in0_local = (ShaderInput *)Evaluator<9,_7,_94>::evaluate;
  }
  else if (DVar1 == 0x2445e) {
    in0_local = (ShaderInput *)Evaluator<9,_8,_94>::evaluate;
  }
  else if (DVar1 == 0x244de) {
    in0_local = (ShaderInput *)Evaluator<9,_9,_94>::evaluate;
  }
  else if (DVar1 == 0x2455e) {
    in0_local = (ShaderInput *)Evaluator<9,_10,_94>::evaluate;
  }
  else if (DVar1 == 0x245de) {
    in0_local = (ShaderInput *)Evaluator<9,_11,_94>::evaluate;
  }
  else if (DVar1 == 0x2465e) {
    in0_local = (ShaderInput *)Evaluator<9,_12,_94>::evaluate;
  }
  else if (DVar1 == 0x246de) {
    in0_local = (ShaderInput *)Evaluator<9,_13,_94>::evaluate;
  }
  else if (DVar1 == 0x282de) {
    in0_local = (ShaderInput *)Evaluator<10,_5,_94>::evaluate;
  }
  else if (DVar1 == 0x2835e) {
    in0_local = (ShaderInput *)Evaluator<10,_6,_94>::evaluate;
  }
  else if (DVar1 == 0x283de) {
    in0_local = (ShaderInput *)Evaluator<10,_7,_94>::evaluate;
  }
  else if (DVar1 == 0x2845e) {
    in0_local = (ShaderInput *)Evaluator<10,_8,_94>::evaluate;
  }
  else if (DVar1 == 0x284de) {
    in0_local = (ShaderInput *)Evaluator<10,_9,_94>::evaluate;
  }
  else if (DVar1 == 0x2855e) {
    in0_local = (ShaderInput *)Evaluator<10,_10,_94>::evaluate;
  }
  else if (DVar1 == 0x285de) {
    in0_local = (ShaderInput *)Evaluator<10,_11,_94>::evaluate;
  }
  else if (DVar1 == 0x2865e) {
    in0_local = (ShaderInput *)Evaluator<10,_12,_94>::evaluate;
  }
  else if (DVar1 == 0x286de) {
    in0_local = (ShaderInput *)Evaluator<10,_13,_94>::evaluate;
  }
  else if (DVar1 == 0x2c2de) {
    in0_local = (ShaderInput *)Evaluator<11,_5,_94>::evaluate;
  }
  else if (DVar1 == 0x2c35e) {
    in0_local = (ShaderInput *)Evaluator<11,_6,_94>::evaluate;
  }
  else if (DVar1 == 0x2c3de) {
    in0_local = (ShaderInput *)Evaluator<11,_7,_94>::evaluate;
  }
  else if (DVar1 == 0x2c45e) {
    in0_local = (ShaderInput *)Evaluator<11,_8,_94>::evaluate;
  }
  else if (DVar1 == 0x2c4de) {
    in0_local = (ShaderInput *)Evaluator<11,_9,_94>::evaluate;
  }
  else if (DVar1 == 0x2c55e) {
    in0_local = (ShaderInput *)Evaluator<11,_10,_94>::evaluate;
  }
  else if (DVar1 == 0x2c5de) {
    in0_local = (ShaderInput *)Evaluator<11,_11,_94>::evaluate;
  }
  else if (DVar1 == 0x2c65e) {
    in0_local = (ShaderInput *)Evaluator<11,_12,_94>::evaluate;
  }
  else if (DVar1 == 0x2c6de) {
    in0_local = (ShaderInput *)Evaluator<11,_13,_94>::evaluate;
  }
  else if (DVar1 == 0x302de) {
    in0_local = (ShaderInput *)Evaluator<12,_5,_94>::evaluate;
  }
  else if (DVar1 == 0x3035e) {
    in0_local = (ShaderInput *)Evaluator<12,_6,_94>::evaluate;
  }
  else if (DVar1 == 0x303de) {
    in0_local = (ShaderInput *)Evaluator<12,_7,_94>::evaluate;
  }
  else if (DVar1 == 0x3045e) {
    in0_local = (ShaderInput *)Evaluator<12,_8,_94>::evaluate;
  }
  else if (DVar1 == 0x304de) {
    in0_local = (ShaderInput *)Evaluator<12,_9,_94>::evaluate;
  }
  else if (DVar1 == 0x3055e) {
    in0_local = (ShaderInput *)Evaluator<12,_10,_94>::evaluate;
  }
  else if (DVar1 == 0x305de) {
    in0_local = (ShaderInput *)Evaluator<12,_11,_94>::evaluate;
  }
  else if (DVar1 == 0x3065e) {
    in0_local = (ShaderInput *)Evaluator<12,_12,_94>::evaluate;
  }
  else if (DVar1 == 0x306de) {
    in0_local = (ShaderInput *)Evaluator<12,_13,_94>::evaluate;
  }
  else if (DVar1 == 0x342de) {
    in0_local = (ShaderInput *)Evaluator<13,_5,_94>::evaluate;
  }
  else if (DVar1 == 0x3435e) {
    in0_local = (ShaderInput *)Evaluator<13,_6,_94>::evaluate;
  }
  else if (DVar1 == 0x343de) {
    in0_local = (ShaderInput *)Evaluator<13,_7,_94>::evaluate;
  }
  else if (DVar1 == 0x3445e) {
    in0_local = (ShaderInput *)Evaluator<13,_8,_94>::evaluate;
  }
  else if (DVar1 == 0x344de) {
    in0_local = (ShaderInput *)Evaluator<13,_9,_94>::evaluate;
  }
  else if (DVar1 == 0x3455e) {
    in0_local = (ShaderInput *)Evaluator<13,_10,_94>::evaluate;
  }
  else if (DVar1 == 0x345de) {
    in0_local = (ShaderInput *)Evaluator<13,_11,_94>::evaluate;
  }
  else if (DVar1 == 0x3465e) {
    in0_local = (ShaderInput *)Evaluator<13,_12,_94>::evaluate;
  }
  else if (DVar1 == 0x346de) {
    in0_local = (ShaderInput *)Evaluator<13,_13,_94>::evaluate;
  }
  else if (DVar1 == 0x382de) {
    in0_local = (ShaderInput *)Evaluator<14,_5,_94>::evaluate;
  }
  else if (DVar1 == 0x3835e) {
    in0_local = (ShaderInput *)Evaluator<14,_6,_94>::evaluate;
  }
  else if (DVar1 == 0x383de) {
    in0_local = (ShaderInput *)Evaluator<14,_7,_94>::evaluate;
  }
  else if (DVar1 == 0x3845e) {
    in0_local = (ShaderInput *)Evaluator<14,_8,_94>::evaluate;
  }
  else if (DVar1 == 0x384de) {
    in0_local = (ShaderInput *)Evaluator<14,_9,_94>::evaluate;
  }
  else if (DVar1 == 0x3855e) {
    in0_local = (ShaderInput *)Evaluator<14,_10,_94>::evaluate;
  }
  else if (DVar1 == 0x385de) {
    in0_local = (ShaderInput *)Evaluator<14,_11,_94>::evaluate;
  }
  else if (DVar1 == 0x3865e) {
    in0_local = (ShaderInput *)Evaluator<14,_12,_94>::evaluate;
  }
  else if (DVar1 == 0x386de) {
    in0_local = (ShaderInput *)Evaluator<14,_13,_94>::evaluate;
  }
  else if (DVar1 == 0x3c285) {
    in0_local = (ShaderInput *)Evaluator<15,_5,_5>::evaluate;
  }
  else if (DVar1 == 0x3c306) {
    in0_local = (ShaderInput *)Evaluator<15,_6,_6>::evaluate;
  }
  else if (DVar1 == 0x3c387) {
    in0_local = (ShaderInput *)Evaluator<15,_7,_7>::evaluate;
  }
  else if (DVar1 == 0x3c408) {
    in0_local = (ShaderInput *)Evaluator<15,_8,_8>::evaluate;
  }
  else if (DVar1 == 0x3c489) {
    in0_local = (ShaderInput *)Evaluator<15,_9,_9>::evaluate;
  }
  else if (DVar1 == 0x3c50a) {
    in0_local = (ShaderInput *)Evaluator<15,_10,_10>::evaluate;
  }
  else if (DVar1 == 0x3c58b) {
    in0_local = (ShaderInput *)Evaluator<15,_11,_11>::evaluate;
  }
  else if (DVar1 == 0x3c60c) {
    in0_local = (ShaderInput *)Evaluator<15,_12,_12>::evaluate;
  }
  else if (DVar1 == 0x3c68d) {
    in0_local = (ShaderInput *)Evaluator<15,_13,_13>::evaluate;
  }
  else if (DVar1 == 0x40285) {
    in0_local = (ShaderInput *)Evaluator<16,_5,_5>::evaluate;
  }
  else if (DVar1 == 0x40306) {
    in0_local = (ShaderInput *)Evaluator<16,_6,_6>::evaluate;
  }
  else if (DVar1 == 0x40387) {
    in0_local = (ShaderInput *)Evaluator<16,_7,_7>::evaluate;
  }
  else if (DVar1 == 0x40408) {
    in0_local = (ShaderInput *)Evaluator<16,_8,_8>::evaluate;
  }
  else if (DVar1 == 0x40489) {
    in0_local = (ShaderInput *)Evaluator<16,_9,_9>::evaluate;
  }
  else if (DVar1 == 0x4050a) {
    in0_local = (ShaderInput *)Evaluator<16,_10,_10>::evaluate;
  }
  else if (DVar1 == 0x4058b) {
    in0_local = (ShaderInput *)Evaluator<16,_11,_11>::evaluate;
  }
  else if (DVar1 == 0x4060c) {
    in0_local = (ShaderInput *)Evaluator<16,_12,_12>::evaluate;
  }
  else if (DVar1 == 0x4068d) {
    in0_local = (ShaderInput *)Evaluator<16,_13,_13>::evaluate;
  }
  else if (DVar1 == 0x44285) {
    in0_local = (ShaderInput *)Evaluator<17,_5,_5>::evaluate;
  }
  else if (DVar1 == 0x44489) {
    in0_local = (ShaderInput *)Evaluator<17,_9,_9>::evaluate;
  }
  else if (DVar1 == 0x4468d) {
    in0_local = (ShaderInput *)Evaluator<17,_13,_13>::evaluate;
  }
  else if (DVar1 == 0x48285) {
    in0_local = (ShaderInput *)Evaluator<18,_5,_5>::evaluate;
  }
  else if (DVar1 == 0x48306) {
    in0_local = (ShaderInput *)Evaluator<18,_6,_6>::evaluate;
  }
  else if (DVar1 == 0x48387) {
    in0_local = (ShaderInput *)Evaluator<18,_7,_7>::evaluate;
  }
  else if (DVar1 == 0x48408) {
    in0_local = (ShaderInput *)Evaluator<18,_8,_8>::evaluate;
  }
  else if (DVar1 == 0x48489) {
    in0_local = (ShaderInput *)Evaluator<18,_9,_9>::evaluate;
  }
  else if (DVar1 == 0x4850a) {
    in0_local = (ShaderInput *)Evaluator<18,_10,_10>::evaluate;
  }
  else if (DVar1 == 0x4858b) {
    in0_local = (ShaderInput *)Evaluator<18,_11,_11>::evaluate;
  }
  else if (DVar1 == 0x4860c) {
    in0_local = (ShaderInput *)Evaluator<18,_12,_12>::evaluate;
  }
  else if (DVar1 == 0x4868d) {
    in0_local = (ShaderInput *)Evaluator<18,_13,_13>::evaluate;
  }
  else {
    in0_local = (ShaderInput *)0x0;
  }
  return (MatrixShaderEvalFunc)in0_local;
}

Assistant:

MatrixShaderEvalFunc getEvalFunc (const ShaderInput& in0, const ShaderInput& in1, MatrixOp op)
{
	// Evaluator is selected based on op and input data types.
	// For efficient lookup the types and op enums are packed together to form a 19-bit key:
	// [18..14 OP] [13..7 TYPE0] [6..0 TYPE1]

	DE_STATIC_ASSERT(TYPE_LAST	<= (1<<7));
	DE_STATIC_ASSERT(OP_LAST	<= (1<<5));

#define PACK_EVAL_CASE(OP, IN0DATATYPE, IN1DATATYPE)	(((OP) << 14) | ((IN0DATATYPE) << 7) | (IN1DATATYPE))

#define MAKE_EVAL_CASE(OP, IN0DATATYPE, IN1DATATYPE)	\
	case PACK_EVAL_CASE(OP, IN0DATATYPE, IN1DATATYPE):	\
		return Evaluator<OP, IN0DATATYPE, IN1DATATYPE>::evaluate

#define MAKE_SCALAR_OPS(IN0DATATYPE, IN1DATATYPE)		\
	MAKE_EVAL_CASE(OP_ADD, IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_SUB, IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_MUL, IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_DIV, IN0DATATYPE, IN1DATATYPE)

#define MAKE_CWISE_OPS(IN0DATATYPE, IN1DATATYPE)			\
	MAKE_EVAL_CASE(OP_ADD,		IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_SUB,		IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_DIV,		IN0DATATYPE, IN1DATATYPE);	\
	MAKE_EVAL_CASE(OP_COMP_MUL,	IN0DATATYPE, IN1DATATYPE)

#define MAKE_MUL_OP(IN0DATATYPE, IN1DATATYPE)			\
	MAKE_EVAL_CASE(OP_MUL, IN0DATATYPE, IN1DATATYPE)

#define MAKE_VECVEC_OP(IN0DATATYPE, IN1DATATYPE)			\
	MAKE_EVAL_CASE(OP_OUTER_PRODUCT, IN0DATATYPE, IN1DATATYPE)

#define MAKE_UNARY_OP(IN0DATATYPE)								\
	MAKE_EVAL_CASE(OP_TRANSPOSE,		IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_UNARY_PLUS,		IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_NEGATION,			IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_PRE_INCREMENT,	IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_PRE_DECREMENT,	IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_POST_INCREMENT,	IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_POST_DECREMENT,	IN0DATATYPE, TYPE_LAST)

#define MAKE_UNARY_SYMMETRIC_OP(IN0DATATYPE)					\
	MAKE_UNARY_OP(IN0DATATYPE);									\
	MAKE_EVAL_CASE(OP_DETERMINANT,	IN0DATATYPE, TYPE_LAST);	\
	MAKE_EVAL_CASE(OP_INVERSE,		IN0DATATYPE, TYPE_LAST)

#define MAKE_ASSIGNMENT_OP(IN0DATATYPE)								\
	MAKE_EVAL_CASE(OP_ADD_INTO,			IN0DATATYPE, IN0DATATYPE);	\
	MAKE_EVAL_CASE(OP_SUBTRACT_FROM,	IN0DATATYPE, IN0DATATYPE);	\
	MAKE_EVAL_CASE(OP_DIVIDE_INTO,		IN0DATATYPE, IN0DATATYPE)

#define MAKE_ASSIGNMENT_SYMMETRIC_OP(IN0DATATYPE)					\
	MAKE_ASSIGNMENT_OP(IN0DATATYPE);								\
	MAKE_EVAL_CASE(OP_MULTIPLY_INTO,	IN0DATATYPE, IN0DATATYPE)

	switch (PACK_EVAL_CASE(op, in0.dataType, in1.dataType))
	{
		// Matrix-scalar.
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT2,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT2X3,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT2X4,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT3X2,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT3,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT3X4,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT4X2,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT4X3,	TYPE_FLOAT);
		MAKE_SCALAR_OPS(TYPE_FLOAT_MAT4,	TYPE_FLOAT);

		// Matrix-vector.
		MAKE_MUL_OP(TYPE_FLOAT_MAT2,	TYPE_FLOAT_VEC2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X3,	TYPE_FLOAT_VEC2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X4,	TYPE_FLOAT_VEC2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X2,	TYPE_FLOAT_VEC3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3,	TYPE_FLOAT_VEC3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X4,	TYPE_FLOAT_VEC3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X2,	TYPE_FLOAT_VEC4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X3,	TYPE_FLOAT_VEC4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4,	TYPE_FLOAT_VEC4);

		// Vector-matrix.
		MAKE_MUL_OP(TYPE_FLOAT_VEC2, TYPE_FLOAT_MAT2);
		MAKE_MUL_OP(TYPE_FLOAT_VEC3, TYPE_FLOAT_MAT2X3);
		MAKE_MUL_OP(TYPE_FLOAT_VEC4, TYPE_FLOAT_MAT2X4);
		MAKE_MUL_OP(TYPE_FLOAT_VEC2, TYPE_FLOAT_MAT3X2);
		MAKE_MUL_OP(TYPE_FLOAT_VEC3, TYPE_FLOAT_MAT3);
		MAKE_MUL_OP(TYPE_FLOAT_VEC4, TYPE_FLOAT_MAT3X4);
		MAKE_MUL_OP(TYPE_FLOAT_VEC2, TYPE_FLOAT_MAT4X2);
		MAKE_MUL_OP(TYPE_FLOAT_VEC3, TYPE_FLOAT_MAT4X3);
		MAKE_MUL_OP(TYPE_FLOAT_VEC4, TYPE_FLOAT_MAT4);

		// Matrix-matrix.
		MAKE_CWISE_OPS(TYPE_FLOAT_MAT2,		TYPE_FLOAT_MAT2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2,		TYPE_FLOAT_MAT2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2,		TYPE_FLOAT_MAT3X2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2,		TYPE_FLOAT_MAT4X2);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT2X3,	TYPE_FLOAT_MAT2X3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X3,		TYPE_FLOAT_MAT2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X3,		TYPE_FLOAT_MAT3X2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X3,		TYPE_FLOAT_MAT4X2);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT2X4,	TYPE_FLOAT_MAT2X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X4,		TYPE_FLOAT_MAT2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X4,		TYPE_FLOAT_MAT3X2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT2X4,		TYPE_FLOAT_MAT4X2);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT3X2,	TYPE_FLOAT_MAT3X2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X2,		TYPE_FLOAT_MAT2X3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X2,		TYPE_FLOAT_MAT3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X2,		TYPE_FLOAT_MAT4X3);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT3,		TYPE_FLOAT_MAT3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3,		TYPE_FLOAT_MAT2X3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3,		TYPE_FLOAT_MAT3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3,		TYPE_FLOAT_MAT4X3);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT3X4,	TYPE_FLOAT_MAT3X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X4,		TYPE_FLOAT_MAT2X3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X4,		TYPE_FLOAT_MAT3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT3X4,		TYPE_FLOAT_MAT4X3);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT4X2,	TYPE_FLOAT_MAT4X2);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X2,		TYPE_FLOAT_MAT2X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X2,		TYPE_FLOAT_MAT3X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X2,		TYPE_FLOAT_MAT4);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT4X3,	TYPE_FLOAT_MAT4X3);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X3,		TYPE_FLOAT_MAT2X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X3,		TYPE_FLOAT_MAT3X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4X3,		TYPE_FLOAT_MAT4);

		MAKE_CWISE_OPS(TYPE_FLOAT_MAT4,		TYPE_FLOAT_MAT4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4,		TYPE_FLOAT_MAT2X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4,		TYPE_FLOAT_MAT3X4);
		MAKE_MUL_OP(TYPE_FLOAT_MAT4,		TYPE_FLOAT_MAT4);

		// Vector-vector.
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC2,		TYPE_FLOAT_VEC2);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC2,		TYPE_FLOAT_VEC3);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC2,		TYPE_FLOAT_VEC4);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC3,		TYPE_FLOAT_VEC2);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC3,		TYPE_FLOAT_VEC3);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC3,		TYPE_FLOAT_VEC4);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC4,		TYPE_FLOAT_VEC2);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC4,		TYPE_FLOAT_VEC3);
		MAKE_VECVEC_OP(TYPE_FLOAT_VEC4,		TYPE_FLOAT_VEC4);

		// Unary Matrix.
		MAKE_UNARY_SYMMETRIC_OP(TYPE_FLOAT_MAT2);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT2X3);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT2X4);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT3X2);
		MAKE_UNARY_SYMMETRIC_OP(TYPE_FLOAT_MAT3);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT3X4);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT4X2);
		MAKE_UNARY_OP(TYPE_FLOAT_MAT4X3);
		MAKE_UNARY_SYMMETRIC_OP(TYPE_FLOAT_MAT4);

		// Assignments
		MAKE_ASSIGNMENT_SYMMETRIC_OP(TYPE_FLOAT_MAT2);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT2X3);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT2X4);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT3X2);
		MAKE_ASSIGNMENT_SYMMETRIC_OP(TYPE_FLOAT_MAT3);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT3X4);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT4X2);
		MAKE_ASSIGNMENT_OP(TYPE_FLOAT_MAT4X3);
		MAKE_ASSIGNMENT_SYMMETRIC_OP(TYPE_FLOAT_MAT4);

		default:
			DE_ASSERT(DE_FALSE);
			return DE_NULL;
	}

#undef PACK_EVAL_CASE
#undef MAKE_EVAL_CASE
#undef MUL_OP
#undef ALL_OPS
#undef MAKE_MAT_SCALAR_VEC_CASES
#undef MAKE_MAT_MAT_CASES
}